

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O0

t_int * fiddle_perform(t_int *w)

{
  t_sigfiddle *x_00;
  t_int tVar1;
  t_float *local_30;
  t_float *fp;
  int count;
  int n;
  t_sigfiddle *x;
  t_float *in;
  t_int *w_local;
  
  x_00 = (t_sigfiddle *)w[2];
  tVar1 = w[3];
  if (x_00->x_hop != 0) {
    fp._0_4_ = 0;
    local_30 = x_00->x_inbuf + x_00->x_phase;
    x = (t_sigfiddle *)w[1];
    for (; (int)fp < (int)tVar1; fp._0_4_ = (int)fp + 1) {
      *local_30 = *(t_float *)&(x->x_ob).te_g.g_pd;
      local_30 = local_30 + 1;
      x = (t_sigfiddle *)((long)&(x->x_ob).te_g.g_pd + 4);
    }
    if (local_30 == x_00->x_inbuf + x_00->x_hop) {
      sigfiddle_doit(x_00);
      x_00->x_phase = 0;
      if (x_00->x_auto != 0) {
        clock_delay(x_00->x_clock,0.0);
      }
      if (x_00->x_nprint != 0) {
        x_00->x_nprint = x_00->x_nprint + -1;
      }
    }
    else {
      x_00->x_phase = (int)tVar1 + x_00->x_phase;
    }
  }
  return w + 4;
}

Assistant:

static t_int *fiddle_perform(t_int *w)
{
    t_float *in = (t_float *)(w[1]);
    t_sigfiddle *x = (t_sigfiddle *)(w[2]);
    int n = (int)(w[3]);
    int count;
    t_float *fp;
    if (!x->x_hop)
        goto nono;
    for (count = 0, fp = x->x_inbuf + x->x_phase; count < n; count++)
        *fp++ = *in++;
    if (fp == x->x_inbuf + x->x_hop)
    {
        sigfiddle_doit(x);
        x->x_phase = 0;
        if (x->x_auto) clock_delay(x->x_clock, 0L);
        if (x->x_nprint) x->x_nprint--;
    }
    else x->x_phase += n;
nono:
    return (w+4);
}